

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

Type __thiscall wabt::LocalTypes::operator[](LocalTypes *this,Index i)

{
  pointer ppVar1;
  pointer ppVar2;
  uint uVar3;
  
  ppVar2 = (this->decls_).
           super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->decls_).
           super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar2 != ppVar1) {
    uVar3 = 0;
    do {
      uVar3 = uVar3 + ppVar2->second;
      if (i < uVar3) {
        return (Type)(ppVar2->first).enum_;
      }
      ppVar2 = ppVar2 + 1;
    } while (ppVar2 != ppVar1);
  }
  __assert_fail("i < count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.cc",
                0xca,"Type wabt::LocalTypes::operator[](Index) const");
}

Assistant:

Type LocalTypes::operator[](Index i) const {
  Index count = 0;
  for (auto decl: decls_) {
    if (i < count + decl.second) {
      return decl.first;
    }
    count += decl.second;
  }
  assert(i < count);
  return Type::Any;
}